

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O2

void drawTriangle(ImVec2 p0,ImVec2 p1,ImVec2 p2,uchar col,TScreen *screen)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_48;
  
  fVar11 = p2.y;
  fVar10 = p1.y;
  fVar9 = p0.y;
  fVar13 = (float)(screen->ny * screen->nx);
  fVar12 = fVar9;
  if (fVar13 <= fVar9) {
    fVar12 = fVar13;
  }
  fVar13 = fVar10;
  if (fVar12 <= fVar10) {
    fVar13 = fVar12;
  }
  fVar12 = fVar11;
  if (fVar13 <= fVar11) {
    fVar12 = fVar13;
  }
  iVar6 = (int)fVar12;
  fVar12 = fVar9;
  if (fVar9 <= 0.0) {
    fVar12 = 0.0;
  }
  fVar13 = fVar10;
  if (fVar10 <= fVar12) {
    fVar13 = fVar12;
  }
  fVar12 = fVar11;
  if (fVar11 <= fVar13) {
    fVar12 = fVar13;
  }
  iVar7 = (int)fVar12 - iVar6;
  iVar8 = iVar7 * 2 + 2;
  if ((int)((ulong)((long)g_xrange.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)g_xrange.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < iVar8) {
    std::vector<int,_std::allocator<int>_>::resize(&g_xrange,(long)iVar8);
  }
  piVar2 = g_xrange.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar8 = iVar7 + 1;
  for (lVar3 = 0; lVar3 <= iVar7; lVar3 = lVar3 + 1) {
    (piVar2 + lVar3 * 2)[0] = 999999;
    (piVar2 + lVar3 * 2)[1] = -999999;
  }
  fVar12 = (float)iVar6;
  ScanLine((int)p0.x,(int)(fVar9 - fVar12),(int)p1.x,(int)(fVar10 - fVar12),iVar8,&g_xrange);
  local_48 = p2.x;
  ScanLine((int)p1.x,(int)(fVar10 - fVar12),(int)local_48,(int)(fVar11 - fVar12),iVar8,&g_xrange);
  ScanLine((int)local_48,(int)(fVar11 - fVar12),(int)p0.x,(int)(fVar9 - fVar12),iVar8,&g_xrange);
  piVar2 = g_xrange.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar3 = (long)iVar6;
  for (lVar4 = 0; lVar4 <= iVar7; lVar4 = lVar4 + 1) {
    iVar8 = piVar2[lVar4 * 2];
    iVar1 = piVar2[lVar4 * 2 + 1];
    if (iVar8 <= iVar1) {
      for (; iVar1 + 1 != iVar8; iVar8 = iVar8 + 1) {
        if ((((-1 < iVar8) && (iVar8 < screen->nx)) && (-1 < lVar4 + lVar3)) &&
           (lVar4 + lVar3 < (long)screen->ny)) {
          uVar5 = (ulong)(uint)(screen->nx * iVar6 + iVar8);
          screen->data[uVar5] =
               (uint)*(byte *)((long)screen->data + uVar5 * 4 + 2) * 0x10000 + (uint)col * 0x1000000
               + 0x20;
        }
      }
    }
    iVar6 = iVar6 + 1;
  }
  return;
}

Assistant:

void drawTriangle(ImVec2 p0, ImVec2 p1, ImVec2 p2, unsigned char col, ImTui::TScreen * screen) {
    int ymin = std::min(std::min(std::min((float) screen->size(), p0.y), p1.y), p2.y);
    int ymax = std::max(std::max(std::max(0.0f, p0.y), p1.y), p2.y);

    int ydelta = ymax - ymin + 1;

    if ((int) g_xrange.size() < 2*ydelta) {
        g_xrange.resize(2*ydelta);
    }

    for (int y = 0; y < ydelta; y++) {
        g_xrange[2*y+0] = 999999;
        g_xrange[2*y+1] = -999999;
    }

    ScanLine(p0.x, p0.y - ymin, p1.x, p1.y - ymin, ydelta, g_xrange);
    ScanLine(p1.x, p1.y - ymin, p2.x, p2.y - ymin, ydelta, g_xrange);
    ScanLine(p2.x, p2.y - ymin, p0.x, p0.y - ymin, ydelta, g_xrange);

    for (int y = 0; y < ydelta; y++) {
        if (g_xrange[2*y+1] >= g_xrange[2*y+0]) {
            int x = g_xrange[2*y+0];
            int len = 1 + g_xrange[2*y+1] - g_xrange[2*y+0];

            while (len--) {
                if (x >= 0 && x < screen->nx && y + ymin >= 0 && y + ymin < screen->ny) {
                    auto & cell = screen->data[(y + ymin)*screen->nx + x];
                    cell &= 0x00FF0000;
                    cell |= ' ';
                    cell |= ((ImTui::TCell)(col) << 24);
                }
                ++x;
            }
        }
    }
}